

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateRequestTimeIterativeAsync
               (HelicsFederate fed,HelicsTime requestTime,HelicsIterationRequest iterate,
               HelicsError *err)

{
  Federate *this;
  IterationRequest iterate_00;
  FedObject *pFVar1;
  Time nextInternalTimeStep;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    nextInternalTimeStep.internalTimeCode = 0x7fffffffffffffff;
    if (requestTime <= -9223372036.854765) {
      nextInternalTimeStep.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (requestTime < 9223372036.854765) {
      nextInternalTimeStep.internalTimeCode =
           (baseType)
           (requestTime * 1000000000.0 +
           *(double *)(&DAT_004296c0 + (ulong)(0.0 <= requestTime * 1000000000.0) * 8));
    }
    iterate_00 = (IterationRequest)(0x700030000020100 >> ((char)iterate * '\b' & 0x3fU));
    if (HELICS_ITERATION_REQUEST_ERROR < iterate) {
      iterate_00 = NO_ITERATIONS;
    }
    helics::Federate::requestTimeIterativeAsync(this,nextInternalTimeStep,iterate_00);
  }
  return;
}

Assistant:

void helicsFederateRequestTimeIterativeAsync(HelicsFederate fed, HelicsTime requestTime, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->requestTimeIterativeAsync(requestTime, getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}